

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool is_valid_elements_tx(wally_tx *tx)

{
  _Bool _Var1;
  ulong local_20;
  size_t i;
  wally_tx *tx_local;
  
  if ((tx->num_inputs == 0) && (tx->num_outputs == 0)) {
    tx_local._7_1_ = false;
  }
  else {
    for (local_20 = 0; local_20 < tx->num_inputs; local_20 = local_20 + 1) {
      _Var1 = is_valid_elements_tx_input(tx->inputs + local_20);
      if (!_Var1) {
        return false;
      }
    }
    for (local_20 = 0; local_20 < tx->num_outputs; local_20 = local_20 + 1) {
      _Var1 = is_valid_elements_tx_output(tx->outputs + local_20);
      if (!_Var1) {
        return false;
      }
    }
    tx_local._7_1_ = true;
  }
  return tx_local._7_1_;
}

Assistant:

static bool is_valid_elements_tx(const struct wally_tx *tx)
{
    size_t i;

    if (!tx->num_inputs && !tx->num_outputs)
        return false; /* No inputs & no outputs, treat as non-elements tx */

    for (i = 0; i < tx->num_inputs; ++i)
        if (!is_valid_elements_tx_input(tx->inputs + i))
            return false;

    for (i = 0; i < tx->num_outputs; ++i)
        if (!is_valid_elements_tx_output(tx->outputs + i))
            return false;

    return true;
}